

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_parameter_map.cpp
# Opt level: O3

LogicalType * __thiscall
duckdb::BoundParameterMap::GetReturnType
          (LogicalType *__return_storage_ptr__,BoundParameterMap *this,string *identifier)

{
  iterator iVar1;
  
  iVar1 = ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this->parameter_data->_M_h,identifier);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_true>
      ._M_cur == (__node_type *)0x0) {
    LogicalType::LogicalType(__return_storage_ptr__,UNKNOWN);
  }
  else {
    LogicalType::LogicalType
              (__return_storage_ptr__,
               (LogicalType *)
               ((long)iVar1.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_true>
                      ._M_cur + 0x68));
  }
  return __return_storage_ptr__;
}

Assistant:

LogicalType BoundParameterMap::GetReturnType(const string &identifier) {
	D_ASSERT(!identifier.empty());
	auto it = parameter_data.find(identifier);
	if (it == parameter_data.end()) {
		return LogicalTypeId::UNKNOWN;
	}
	return it->second.return_type;
}